

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

void __thiscall
Assembler::instr5Bytes(Assembler *this,string *instrDescr,int regsDescr,int addrMode,int value)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  *this_00;
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  char local_39;
  char local_38;
  char local_37;
  char local_36;
  char local_35;
  int local_34;
  
  this_00 = &this->codeBySection;
  local_34 = addrMode;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&currentSectionName_abi_cxx11_);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->instrDescription,instrDescr);
  local_35 = (char)*pmVar2;
  std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar1,&local_35);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&currentSectionName_abi_cxx11_);
  local_36 = (char)regsDescr;
  std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar1,&local_36);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&currentSectionName_abi_cxx11_);
  local_37 = (char)local_34;
  std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar1,&local_37);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&currentSectionName_abi_cxx11_);
  local_38 = (char)value;
  std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar1,&local_38);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&currentSectionName_abi_cxx11_);
  local_39 = (char)((uint)value >> 8);
  std::vector<char,_std::allocator<char>_>::emplace_back<char>(pmVar1,&local_39);
  return;
}

Assistant:

void Assembler::instr5Bytes(string instrDescr, int regsDescr, int addrMode, int value) {

    codeBySection[currentSectionName].push_back(instrDescription[instrDescr]);
    codeBySection[currentSectionName].push_back(regsDescr);
    codeBySection[currentSectionName].push_back(addrMode);
    codeBySection[currentSectionName].push_back(value & 0xff);
    codeBySection[currentSectionName].push_back((value >> 8) & 0xff);


    return;

}